

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

boolean encode_mcu_DC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  j_compress_ptr in_RSI;
  long in_RDI;
  int blkn;
  int Al;
  uchar *st;
  arith_entropy_ptr entropy;
  undefined4 local_28;
  long lVar1;
  
  lVar1 = *(long *)(in_RDI + 0x1f0);
  if (*(int *)(in_RDI + 0x118) != 0) {
    if (*(int *)(lVar1 + 0x60) == 0) {
      emit_restart(in_RSI,(int)((ulong)lVar1 >> 0x20));
      *(undefined4 *)(lVar1 + 0x60) = *(undefined4 *)(in_RDI + 0x118);
      *(int *)(lVar1 + 100) = *(int *)(lVar1 + 100) + 1;
      *(uint *)(lVar1 + 100) = *(uint *)(lVar1 + 100) & 7;
    }
    *(int *)(lVar1 + 0x60) = *(int *)(lVar1 + 0x60) + -1;
  }
  for (local_28 = 0; local_28 < *(int *)(in_RDI + 0x170); local_28 = local_28 + 1) {
    arith_encode((j_compress_ptr)entropy,st,Al);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_DC_refine(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  unsigned char *st;
  int Al, blkn;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  st = entropy->fixed_bin;      /* use fixed probability estimation */
  Al = cinfo->Al;

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    /* We simply emit the Al'th bit of the DC coefficient value. */
    arith_encode(cinfo, st, (MCU_data[blkn][0][0] >> Al) & 1);
  }

  return TRUE;
}